

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

Option * __thiscall CLI::Option::excludes(Option *this,Option *opt)

{
  OptionAlreadyAdded *__return_storage_ptr__;
  pair<std::_Rb_tree_const_iterator<CLI::Option_*>,_bool> pVar1;
  string local_88;
  string local_58;
  _Base_ptr local_38;
  undefined1 local_30;
  _Base_ptr local_28;
  pair<std::_Rb_tree_const_iterator<CLI::Option_*>,_bool> tup;
  Option *opt_local;
  Option *this_local;
  
  tup._8_8_ = opt;
  pVar1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::insert
                    (&this->excludes_,(value_type *)&tup.second);
  local_38 = (_Base_ptr)pVar1.first._M_node;
  local_30 = pVar1.second;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_28 = local_38;
    tup.first._M_node._0_1_ = local_30;
    __return_storage_ptr__ = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
    get_name_abi_cxx11_(&local_58,this,false);
    get_name_abi_cxx11_(&local_88,(Option *)tup._8_8_,false);
    OptionAlreadyAdded::Excludes(__return_storage_ptr__,&local_58,&local_88);
    __cxa_throw(__return_storage_ptr__,&OptionAlreadyAdded::typeinfo,
                OptionAlreadyAdded::~OptionAlreadyAdded);
  }
  return this;
}

Assistant:

Option *excludes(Option *opt) {
        auto tup = excludes_.insert(opt);
        if(!tup.second)
            throw OptionAlreadyAdded::Excludes(get_name(), opt->get_name());
        return this;
    }